

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_statemach_act(connectdata *conn)

{
  anon_union_224_10_26c073a1_for_proto *pp;
  char cVar1;
  ftpstate instate;
  curl_usessl cVar2;
  uint uVar3;
  curl_TimeCond cVar4;
  SessionHandle *pSVar5;
  void *pvVar6;
  long lVar7;
  ulong uVar8;
  undefined8 uVar9;
  bool bVar10;
  byte bVar11;
  CURLcode CVar12;
  int iVar13;
  CURLcode CVar14;
  time_t tVar15;
  char *pcVar16;
  ushort **ppuVar17;
  int *piVar18;
  char *pcVar19;
  ulong uVar20;
  uint uVar21;
  ftpport fcmd;
  char *pcVar23;
  long lVar24;
  int month;
  short local_16c [2];
  SessionHandle *local_168;
  int year;
  size_t nread;
  int ftpcode;
  int second;
  int minute;
  int hour;
  int day;
  time_t secs;
  undefined8 uStack_130;
  undefined8 local_128;
  int local_120;
  short *psVar22;
  
  pSVar5 = conn->data;
  nread = 0;
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar12 = Curl_pp_flushsend(&(pp->ftpc).pp);
    return CVar12;
  }
  CVar12 = ftp_readresp(conn->sock[0],&(pp->ftpc).pp,&ftpcode,&nread);
  if (CVar12 != CURLE_OK) {
    return CVar12;
  }
  if (ftpcode == 0) {
    return CURLE_OK;
  }
  instate = (conn->proto).ftpc.state;
  switch(instate) {
  case FTP_WAIT220:
    if (ftpcode != 0xdc) {
      if (ftpcode == 0xe6) {
        CVar12 = ftp_state_loggedin(conn);
        return CVar12;
      }
      Curl_failf(pSVar5,"Got a %03d ftp-server response when 220 was expected",(ulong)(uint)ftpcode)
      ;
      return CURLE_FTP_WEIRD_SERVER_REPLY;
    }
    if (((pSVar5->set).use_ssl != CURLUSESSL_NONE) && (conn->ssl[0].use == false)) {
      (conn->proto).ftpc.count3 = 0;
      uVar20 = (ulong)(pSVar5->set).ftpsslauth;
      if (2 < uVar20) {
        Curl_failf(pSVar5,"unsupported parameter to CURLOPT_FTPSSLAUTH: %d");
        return CURLE_UNKNOWN_OPTION;
      }
      iVar13 = *(int *)(&DAT_0058d590 + uVar20 * 4);
      lVar24 = *(long *)(&DAT_0058d5a0 + uVar20 * 8);
      (conn->proto).ftpc.count2 = *(int *)(&DAT_0058d584 + uVar20 * 4);
      (conn->proto).ftpc.count1 = iVar13;
      CVar12 = Curl_pp_sendf(&(pp->ftpc).pp,"AUTH %s",ftp_statemach_act::ftpauth + lVar24);
      if (CVar12 != CURLE_OK) {
        return CVar12;
      }
      (conn->proto).ftpc.state = FTP_AUTH;
      return CURLE_OK;
    }
    CVar14 = ftp_state_user(conn);
    goto joined_r0x005205d4;
  case FTP_AUTH:
    if (ftpcode == 0xea) {
      return CURLE_NOT_BUILT_IN;
    }
    if (ftpcode == 0x14e) {
      return CURLE_NOT_BUILT_IN;
    }
    iVar13 = (conn->proto).ftpc.count3;
    if (iVar13 < 1) {
      (conn->proto).ftpc.count3 = iVar13 + 1;
      lVar24 = (long)(conn->proto).ftpc.count1 + (long)(conn->proto).ftpc.count2;
      (conn->proto).ftpc.count1 = (int)lVar24;
      CVar14 = Curl_pp_sendf(&(pp->ftpc).pp,"AUTH %s",ftp_statemach_act::ftpauth + lVar24);
    }
    else {
      if (CURLUSESSL_TRY < (pSVar5->set).use_ssl) {
        return CURLE_USE_SSL_FAILED;
      }
      CVar14 = ftp_state_user(conn);
    }
    goto joined_r0x005205d4;
  case FTP_USER:
  case FTP_PASS:
    pSVar5 = conn->data;
    if (ftpcode == 0x14b) {
      if (instate == FTP_USER) {
        pcVar16 = *(char **)((long)(pSVar5->req).protop + 0x10);
        pcVar23 = "";
        if (pcVar16 != (char *)0x0) {
          pcVar23 = pcVar16;
        }
        CVar12 = Curl_pp_sendf(&(pp->ftpc).pp,"PASS %s",pcVar23);
        if (CVar12 == CURLE_OK) {
          (conn->proto).ftpc.state = FTP_PASS;
          return CURLE_OK;
        }
        return CVar12;
      }
LAB_00520162:
      if (((pSVar5->set).str[8] != (char *)0x0) && ((pSVar5->state).ftp_trying_alternative == false)
         ) {
        CVar12 = Curl_pp_sendf(&(pp->ftpc).pp,"%s");
        if (CVar12 == CURLE_OK) {
          (conn->data->state).ftp_trying_alternative = true;
          (conn->proto).ftpc.state = FTP_USER;
          return CURLE_OK;
        }
        return CVar12;
      }
      Curl_failf(pSVar5,"Access denied: %03d",(ulong)(uint)ftpcode);
    }
    else {
      if (ftpcode - 200U < 100) goto LAB_0051fb51;
      if (ftpcode != 0x14c) goto LAB_00520162;
      if ((pSVar5->set).str[7] != (char *)0x0) {
        CVar12 = Curl_pp_sendf(&(pp->ftpc).pp,"ACCT %s");
        if (CVar12 == CURLE_OK) {
          (conn->proto).ftpc.state = FTP_ACCT;
          return CURLE_OK;
        }
        return CVar12;
      }
      Curl_failf(pSVar5,"ACCT requested but none available");
    }
    CVar12 = CURLE_LOGIN_DENIED;
    break;
  case FTP_ACCT:
    if (ftpcode != 0xe6) {
      Curl_failf(conn->data,"ACCT rejected by server: %03d",(ulong)(uint)ftpcode);
      return CURLE_FTP_WEIRD_PASS_REPLY;
    }
LAB_0051fb51:
    CVar12 = ftp_state_loggedin(conn);
    break;
  case FTP_PBSZ:
    uVar9 = 0x50;
    if ((pSVar5->set).use_ssl == CURLUSESSL_CONTROL) {
      uVar9 = 0x43;
    }
    CVar12 = CURLE_OK;
    CVar14 = Curl_pp_sendf(&(pp->ftpc).pp,"PROT %c",uVar9);
    if (CVar14 != CURLE_OK) {
      return CVar14;
    }
    (conn->proto).ftpc.state = FTP_PROT;
    break;
  case FTP_PROT:
    cVar2 = (pSVar5->set).use_ssl;
    if (ftpcode - 200U < 100) {
      conn->ssl[1].use = cVar2 != CURLUSESSL_CONTROL;
    }
    else if (CURLUSESSL_CONTROL < cVar2) {
      return CURLE_USE_SSL_FAILED;
    }
    if ((pSVar5->set).ftp_ccc != CURLFTPSSL_CCC_NONE) {
      CVar12 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","CCC");
      if (CVar12 != CURLE_OK) {
        return CVar12;
      }
      (conn->proto).ftpc.state = FTP_CCC;
      return CURLE_OK;
    }
    goto LAB_0052021f;
  case FTP_CCC:
    if (ftpcode < 500) {
      Curl_failf(conn->data,"Failed to clear the command channel (CCC)");
      return CURLE_NOT_BUILT_IN;
    }
LAB_0052021f:
    CVar14 = ftp_state_pwd(conn);
    goto joined_r0x005205d4;
  case FTP_PWD:
    if (ftpcode == 0x101) {
      pcVar16 = (char *)(*Curl_cmalloc)(nread + 1);
      if (pcVar16 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pcVar23 = (pSVar5->state).uploadbuffer;
      for (lVar24 = 0x894; lVar24 != 0x4891; lVar24 = lVar24 + 1) {
        bVar11 = *(byte *)((long)pSVar5->sockets + lVar24 + -0x38);
        if (((ulong)bVar11 < 0x23) && ((0x400000401U >> ((ulong)bVar11 & 0x3f) & 1) != 0)) {
          pcVar23 = (char *)((long)pSVar5->sockets + lVar24 + -0x38);
          goto LAB_0052074b;
        }
      }
      bVar11 = *pcVar23;
LAB_0052074b:
      pcVar19 = pcVar16;
      if (bVar11 == 0x22) {
LAB_00520753:
        cVar1 = pcVar23[1];
        if (cVar1 != '\"') {
          if (cVar1 == '\0') goto LAB_005207b3;
          pcVar23 = pcVar23 + 1;
LAB_0052076f:
          *pcVar19 = cVar1;
          pcVar19 = pcVar19 + 1;
          goto LAB_00520753;
        }
        if (pcVar23[2] == '\"') {
          pcVar23 = pcVar23 + 2;
          goto LAB_0052076f;
        }
        *pcVar19 = '\0';
LAB_005207b3:
        if (((conn->proto).ftpc.server_os == (char *)0x0) && (*pcVar16 != '/')) {
          CVar12 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","SYST");
          if (CVar12 == CURLE_OK) {
            (*Curl_cfree)((conn->proto).ftpc.entrypath);
            (conn->proto).ftpc.entrypath = pcVar16;
            Curl_infof(pSVar5,"Entry path is \'%s\'\n",pcVar16);
            (pSVar5->state).most_recent_ftp_entrypath = (conn->proto).ftpc.entrypath;
            (conn->proto).ftpc.state = FTP_SYST;
            return CURLE_OK;
          }
          goto LAB_00520410;
        }
        (*Curl_cfree)((conn->proto).ftpc.entrypath);
        (conn->proto).ftpc.entrypath = pcVar16;
        Curl_infof(pSVar5,"Entry path is \'%s\'\n",pcVar16);
        (pSVar5->state).most_recent_ftp_entrypath = (conn->proto).ftpc.entrypath;
      }
      else {
        (*Curl_cfree)(pcVar16);
        Curl_infof(pSVar5,"Failed to figure out path\n");
      }
    }
  default:
switchD_0051f7dc_default:
    (conn->proto).ftpc.state = FTP_STOP;
    CVar12 = CURLE_OK;
    break;
  case FTP_SYST:
    if (ftpcode == 0xd7) {
      pcVar16 = (char *)(*Curl_cmalloc)(nread + 1);
      if (pcVar16 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pcVar23 = (pSVar5->state).buffer + 4;
      do {
        bVar11 = *pcVar23;
        pcVar23 = pcVar23 + 1;
      } while (bVar11 == 0x20);
      lVar24 = 0;
      while ((bVar11 & 0xdf) != 0) {
        pcVar16[lVar24] = bVar11;
        pcVar19 = pcVar23 + lVar24;
        lVar24 = lVar24 + 1;
        bVar11 = *pcVar19;
      }
      pcVar16[lVar24] = '\0';
      iVar13 = curl_strequal(pcVar16,"OS/400");
      if (iVar13 != 0) {
        CVar12 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","SITE NAMEFMT 1");
        if (CVar12 == CURLE_OK) {
          (*Curl_cfree)((conn->proto).ftpc.server_os);
          (conn->proto).ftpc.server_os = pcVar16;
          (conn->proto).ftpc.state = FTP_NAMEFMT;
          return CURLE_OK;
        }
LAB_00520410:
        (*Curl_cfree)(pcVar16);
        return CVar12;
      }
      (*Curl_cfree)((conn->proto).ftpc.server_os);
      (conn->proto).ftpc.server_os = pcVar16;
    }
    goto switchD_0051f7dc_default;
  case FTP_NAMEFMT:
    if (ftpcode == 0xfa) {
      ftp_state_pwd(conn);
      return CURLE_OK;
    }
    goto switchD_0051f7dc_default;
  case FTP_QUOTE:
  case FTP_RETR_PREQUOTE:
  case FTP_STOR_PREQUOTE:
  case FTP_POSTQUOTE:
    if ((399 < ftpcode) && ((conn->proto).ftpc.count2 == 0)) {
      Curl_failf(conn->data,"QUOT command failed with %03d",(ulong)(uint)ftpcode);
      return CURLE_QUOTE_ERROR;
    }
    CVar14 = ftp_state_quote(conn,false,instate);
    goto joined_r0x005205d4;
  case FTP_CWD:
    if (99 < ftpcode - 200U) {
      if ((((conn->data->set).ftp_create_missing_dirs != 0) &&
          (lVar24 = (long)(conn->proto).ftpc.count1, lVar24 != 0)) &&
         ((conn->proto).ftpc.count2 == 0)) {
        (conn->proto).ftpc.count2 = 1;
        CVar12 = Curl_pp_sendf(&(pp->ftpc).pp,"MKD %s",
                               *(undefined8 *)(((conn->proto).pop3c.eob - 8) + lVar24 * 8));
        if (CVar12 != CURLE_OK) {
          return CVar12;
        }
        (conn->proto).ftpc.state = FTP_MKD;
        return CURLE_OK;
      }
      Curl_failf(pSVar5,"Server denied you to change to the given directory");
      (conn->proto).ftpc.cwdfail = true;
      return CURLE_REMOTE_ACCESS_DENIED;
    }
    (conn->proto).ftpc.count2 = 0;
    iVar13 = (conn->proto).ftpc.count1;
    (conn->proto).ftpc.count1 = iVar13 + 1;
    if (iVar13 < (conn->proto).ftpc.dirdepth) {
      pcVar16 = (conn->proto).ftpc.dirs[iVar13];
      goto LAB_0051ffe4;
    }
    CVar14 = ftp_state_mdtm(conn);
    goto joined_r0x005205d4;
  case FTP_MKD:
    if (99 < ftpcode - 200U) {
      piVar18 = &(conn->proto).ftpc.count3;
      iVar13 = *piVar18;
      *piVar18 = *piVar18 + -1;
      if (iVar13 == 0) {
        Curl_failf(pSVar5,"Failed to MKD dir: %03d",(ulong)(uint)ftpcode);
        return CURLE_REMOTE_ACCESS_DENIED;
      }
    }
    (conn->proto).ftpc.state = FTP_CWD;
    pcVar16 = *(char **)(((conn->proto).pop3c.eob - 8) + (long)(conn->proto).ftpc.count1 * 8);
LAB_0051ffe4:
    CVar14 = Curl_pp_sendf(&(pp->ftpc).pp,"CWD %s",pcVar16);
joined_r0x005205d4:
    CVar12 = CURLE_OK;
    if (CVar14 != CURLE_OK) {
      return CVar14;
    }
    break;
  case FTP_MDTM:
    pSVar5 = conn->data;
    pvVar6 = (pSVar5->req).protop;
    if (ftpcode == 0x226) {
      bVar10 = false;
      Curl_failf(pSVar5,"Given file does not exist");
      CVar12 = CURLE_FTP_COULDNT_RETR_FILE;
    }
    else {
      if (ftpcode == 0xd5) {
        pcVar16 = (pSVar5->state).buffer;
        iVar13 = __isoc99_sscanf((pSVar5->state).buffer + 4,"%04d%02d%02d%02d%02d%02d",&year,&month,
                                 &day,&hour,&minute,&second);
        if (iVar13 == 6) {
          secs = time((time_t *)0x0);
          curl_msnprintf(pcVar16,0x4001,"%04d%02d%02d %02d:%02d:%02d GMT",(ulong)_year & 0xffffffff,
                         (ulong)(uint)month,(ulong)(uint)day,(ulong)(uint)hour,(ulong)(uint)minute,
                         (ulong)(uint)second);
          tVar15 = curl_getdate(pcVar16,&secs);
          (pSVar5->info).filetime = tVar15;
        }
        if (((((pSVar5->set).opt_no_body == true) && ((conn->proto).ftpc.file != (char *)0x0)) &&
            ((pSVar5->set).get_filetime == true)) && (lVar24 = (pSVar5->info).filetime, -1 < lVar24)
           ) {
          CVar12 = Curl_gmtime(lVar24,(tm *)&secs);
          if (CVar12 != CURLE_OK) {
            return CVar12;
          }
          iVar13 = 6;
          if (local_120 != 0) {
            iVar13 = local_120 + -1;
          }
          local_168 = (SessionHandle *)(uStack_130 & 0xffffffff);
          curl_msnprintf(pcVar16,0x3fff,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                         Curl_wkday[iVar13],uStack_130 >> 0x20,Curl_month[(int)local_128],
                         (ulong)(local_128._4_4_ + 0x76c),local_168,(ulong)secs >> 0x20,
                         secs & 0xffffffff);
          CVar12 = Curl_client_write(conn,3,pcVar16,0);
          if (CVar12 != CURLE_OK) {
            return CVar12;
          }
        }
      }
      else {
        Curl_infof(pSVar5,"unsupported MDTM reply format\n");
      }
      CVar12 = CURLE_OK;
      bVar10 = true;
    }
    cVar4 = (pSVar5->set).timecondition;
    if (cVar4 != CURL_TIMECOND_NONE) {
      uVar20 = (pSVar5->info).filetime;
      if (((long)uVar20 < 1) || (uVar8 = (pSVar5->set).timevalue, (long)uVar8 < 1)) {
        Curl_infof(pSVar5,"Skipping time comparison\n");
      }
      else if (cVar4 == CURL_TIMECOND_IFUNMODSINCE) {
        if (uVar8 < uVar20) {
          pcVar16 = "The requested document is not old enough\n";
LAB_0052067e:
          Curl_infof(pSVar5,pcVar16);
          *(undefined4 *)((long)pvVar6 + 0x18) = 2;
          (pSVar5->info).timecond = true;
          goto switchD_0051f7dc_default;
        }
      }
      else if (uVar20 <= uVar8) {
        pcVar16 = "The requested document is not new enough\n";
        goto LAB_0052067e;
      }
    }
    if (bVar10) {
      CVar12 = ftp_state_type(conn);
    }
    break;
  case FTP_TYPE:
  case FTP_LIST_TYPE:
  case FTP_RETR_TYPE:
  case FTP_STOR_TYPE:
    CVar12 = ftp_state_type_resp(conn,ftpcode,instate);
    break;
  case FTP_SIZE:
  case FTP_RETR_SIZE:
  case FTP_STOR_SIZE:
    pSVar5 = conn->data;
    if (ftpcode == 0xd5) {
      lVar24 = strtol((pSVar5->state).buffer + 4,(char **)0x0,0);
    }
    else {
      lVar24 = -1;
    }
    if (instate == FTP_STOR_SIZE) {
      (pSVar5->state).resume_from = lVar24;
      CVar12 = ftp_state_ul_setup(conn,true);
    }
    else if (instate == FTP_RETR_SIZE) {
      Curl_pgrsSetDownloadSize(pSVar5,lVar24);
      CVar12 = ftp_state_retr(conn,lVar24);
    }
    else {
      pcVar16 = (pSVar5->state).buffer;
      if (lVar24 != -1) {
        curl_msnprintf(pcVar16,0x4001,"Content-Length: %ld\r\n");
        CVar12 = Curl_client_write(conn,3,pcVar16,0);
        if (CVar12 != CURLE_OK) {
          return CVar12;
        }
      }
      Curl_pgrsSetDownloadSize(pSVar5,lVar24);
      CVar12 = ftp_state_rest(conn);
    }
    break;
  case FTP_REST:
  case FTP_RETR_REST:
    if (instate == FTP_RETR_REST) {
      if (ftpcode == 0x15e) {
        CVar12 = Curl_pp_sendf(&(pp->ftpc).pp,"RETR %s",(conn->proto).ftpc.file);
        if (CVar12 == CURLE_OK) {
          (conn->proto).ftpc.state = FTP_RETR;
          CVar12 = CURLE_OK;
        }
      }
      else {
        Curl_failf(conn->data,"Couldn\'t use REST");
        CVar12 = CURLE_FTP_COULDNT_USE_REST;
      }
    }
    else {
      if (ftpcode == 0x15e) {
        secs._0_1_ = 'A';
        secs._1_1_ = 'c';
        secs._2_1_ = 'c';
        secs._3_1_ = 'e';
        secs._4_1_ = 'p';
        secs._5_1_ = 't';
        secs._6_1_ = '-';
        secs._7_1_ = 'r';
        uStack_130._0_1_ = 'a';
        uStack_130._1_1_ = 'n';
        uStack_130._2_1_ = 'g';
        uStack_130._3_1_ = 'e';
        uStack_130._4_1_ = 's';
        uStack_130._5_1_ = ':';
        uStack_130._6_1_ = ' ';
        uStack_130._7_1_ = 'b';
        local_128._0_4_ = 0x73657479;
        local_128._4_4_ = 0xa0d;
        CVar12 = Curl_client_write(conn,3,(char *)&secs,0);
        if (CVar12 != CURLE_OK) {
          return CVar12;
        }
      }
      CVar12 = ftp_state_prepare_transfer(conn);
    }
    break;
  case FTP_PORT:
    pSVar5 = conn->data;
    if (ftpcode - 200U < 100) {
      Curl_infof(pSVar5,"Connect data stream actively\n");
      (conn->proto).ftpc.state = FTP_STOP;
      CVar12 = ftp_dophase_done(conn,false);
    }
    else {
      iVar13 = (conn->proto).ftpc.count1;
      if (iVar13 == 0) {
        Curl_infof(pSVar5,"disabling EPRT usage\n");
        (conn->bits).ftp_use_eprt = false;
        fcmd = PORT;
      }
      else {
        fcmd = iVar13 + PORT;
        if (fcmd == DONE) {
          Curl_failf(pSVar5,"Failed to do PORT");
          return CURLE_FTP_PORT_FAILED;
        }
      }
      CVar12 = ftp_state_use_port(conn,fcmd);
    }
    break;
  case FTP_PRET:
    if (ftpcode != 200) {
      Curl_failf(pSVar5,"PRET command not accepted: %03d",(ulong)(uint)ftpcode);
      return CURLE_FTP_PRET_FAILED;
    }
    CVar12 = ftp_state_use_pasv(conn);
    break;
  case FTP_PASV:
    pSVar5 = conn->data;
    _year = (Curl_dns_entry *)0x0;
    pcVar16 = (pSVar5->state).buffer + 4;
    (*Curl_cfree)((conn->proto).ftpc.newhost);
    (conn->proto).ftpc.newhost = (char *)0x0;
    uVar3 = (conn->proto).ftpc.count1;
    if (ftpcode == 0xe5 && uVar3 == 0) {
      pcVar16 = strchr(pcVar16,0x28);
      if ((pcVar16 == (char *)0x0) ||
         (iVar13 = __isoc99_sscanf(pcVar16 + 1,"%c%c%c%u%c",&month,(long)&month + 1,(long)&month + 2
                                   ,&secs,(long)&month + 3), iVar13 != 5)) {
LAB_0051ffb1:
        pcVar16 = "Weirdly formatted EPSV reply";
      }
      else {
        lVar24 = 1;
        do {
          if (lVar24 == 4) {
            if (0xffff < (uint)secs) goto LAB_005207a4;
            (conn->proto).ftpc.newport = (unsigned_short)(uint)secs;
            if (((conn->bits).tunnel_proxy == false) &&
               ((conn->proxytype & 0xfffffffc) != CURLPROXY_SOCKS4)) {
              pcVar16 = conn->ip_addr_str;
            }
            else {
              pcVar16 = (conn->host).name;
            }
            local_168 = pSVar5;
            pcVar16 = (*Curl_cstrdup)(pcVar16);
            (conn->proto).ftpc.newhost = pcVar16;
            if (pcVar16 == (char *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            goto LAB_005209a6;
          }
          lVar7 = lVar24 + -4;
          lVar24 = lVar24 + 1;
        } while (*(char *)((long)local_16c + lVar7) == (char)month);
        if ((uint)secs < 0x10000) goto LAB_0051ffb1;
LAB_005207a4:
        pcVar16 = "Illegal port number in EPSV reply";
      }
      Curl_failf(pSVar5,pcVar16);
    }
    else {
      piVar18 = (int *)(ulong)(uVar3 ^ 1);
      uVar21 = ftpcode ^ 0xe3U | uVar3 ^ 1;
      psVar22 = (short *)(ulong)uVar21;
      if (uVar21 == 0) {
        local_168 = pSVar5;
        do {
          if (*pcVar16 == '\0') {
LAB_00520654:
            Curl_failf(local_168,"Couldn\'t interpret the 227-response",psVar22,piVar18);
            return CURLE_FTP_WEIRD_227_FORMAT;
          }
          psVar22 = local_16c;
          piVar18 = &month;
          iVar13 = __isoc99_sscanf(pcVar16,"%d,%d,%d,%d,%d,%d",&secs,(long)&secs + 4,&uStack_130,
                                   (long)&uStack_130 + 4);
          if (iVar13 == 6) {
            if (*pcVar16 != '\0') {
              if ((local_168->set).ftp_skip_ip == true) {
                Curl_infof(local_168,"Skip %d.%d.%d.%d for data connection, re-use %s instead\n");
                if (((conn->bits).tunnel_proxy == false) &&
                   ((conn->proxytype & 0xfffffffc) != CURLPROXY_SOCKS4)) {
                  pcVar16 = conn->ip_addr_str;
                }
                else {
                  pcVar16 = (conn->host).name;
                }
                pcVar16 = (*Curl_cstrdup)(pcVar16);
              }
              else {
                pcVar16 = curl_maprintf("%d.%d.%d.%d",secs & 0xffffffff,(ulong)secs >> 0x20,
                                        uStack_130 & 0xffffffff,uStack_130 >> 0x20);
              }
              (conn->proto).ftpc.newhost = pcVar16;
              if (pcVar16 == (char *)0x0) {
                return CURLE_OUT_OF_MEMORY;
              }
              (conn->proto).ftpc.newport = (short)(month << 8) + local_16c[0];
LAB_005209a6:
              if ((conn->bits).proxy == true) {
                Curl_resolv(conn,(conn->proxy).name,(int)conn->port,(Curl_dns_entry **)&year);
                uVar20 = conn->port;
                if (_year == (Curl_dns_entry *)0x0) {
                  pcVar16 = (conn->proxy).name;
                  uVar20 = uVar20 & 0xffff;
                  pcVar23 = "Can\'t resolve proxy host %s:%hu";
                  goto LAB_00520b01;
                }
              }
              else {
                Curl_resolv(conn,pcVar16,(uint)(conn->proto).ftpc.newport,(Curl_dns_entry **)&year);
                uVar20 = (ulong)(conn->proto).ftpc.newport;
                if (_year == (Curl_dns_entry *)0x0) {
                  pcVar16 = (conn->proto).ftpc.newhost;
                  pcVar23 = "Can\'t resolve new host %s:%hu";
LAB_00520b01:
                  Curl_failf(local_168,pcVar23,pcVar16,uVar20);
                  return CURLE_FTP_CANT_GET_HOST;
                }
              }
              (conn->bits).tcpconnect[1] = false;
              CVar12 = Curl_connecthost(conn,_year);
              if (CVar12 == CURLE_OK) {
                if ((local_168->set).verbose == true) {
                  pcVar16 = (conn->proto).ftpc.newhost;
                  Curl_printable_address(_year->addr,(char *)&secs,0x100);
                  Curl_infof(conn->data,"Connecting to %s (%s) port %d\n",pcVar16,&secs,
                             uVar20 & 0xffff);
                }
                Curl_resolv_unlock(local_168,_year);
                (conn->bits).do_more = true;
                (conn->proto).ftpc.state = FTP_STOP;
                return CURLE_OK;
              }
              Curl_resolv_unlock(local_168,_year);
              if (ftpcode != 0xe5) {
                return CVar12;
              }
              if ((conn->proto).ftpc.count1 != 0) {
                return CVar12;
              }
              goto LAB_00520a5e;
            }
            goto LAB_00520654;
          }
          pcVar16 = pcVar16 + 1;
        } while( true );
      }
      if (uVar3 == 0) {
LAB_00520a5e:
        CVar12 = ftp_epsv_disable(conn);
        return CVar12;
      }
      Curl_failf(pSVar5,"Bad PASV/EPSV response: %03d",(ulong)(uint)ftpcode);
    }
    CVar12 = CURLE_FTP_WEIRD_PASV_REPLY;
    break;
  case FTP_LIST:
  case FTP_RETR:
    pSVar5 = conn->data;
    pvVar6 = (pSVar5->req).protop;
    if ((ftpcode == 0x96) || (ftpcode == 0x7d)) {
      if ((instate == FTP_LIST) ||
         (((pSVar5->set).prefer_ascii != false || (0 < *(long *)((long)pvVar6 + 0x20))))) {
        lVar24 = -1;
        if (-1 < *(long *)((long)pvVar6 + 0x20)) {
          lVar24 = *(long *)((long)pvVar6 + 0x20);
        }
      }
      else {
        lVar24 = -1;
        pcVar16 = strstr((pSVar5->state).buffer," bytes");
        if (pcVar16 != (char *)0x0) {
          lVar24 = (long)pSVar5 + (0x892 - (long)pcVar16);
          for (; (lVar24 != 0 && (bVar11 = pcVar16[-1], (ulong)bVar11 != 0x28));
              pcVar16 = pcVar16 + -1) {
            ppuVar17 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar17 + (ulong)bVar11 * 2 + 1) & 8) == 0) {
              lVar24 = -1;
              goto LAB_0051f930;
            }
            lVar24 = lVar24 + 1;
          }
          lVar24 = strtol(pcVar16,(char **)0x0,0);
        }
      }
LAB_0051f930:
      lVar7 = (pSVar5->req).maxdownload;
      if (lVar7 < 1 || lVar24 <= lVar7) {
        if ((instate != FTP_LIST) && ((pSVar5->set).prefer_ascii != false)) {
          lVar24 = -1;
        }
      }
      else {
        (pSVar5->req).size = lVar7;
        lVar24 = lVar7;
      }
      Curl_infof(pSVar5,"Maxdownload = %ld\n");
      if (instate != FTP_LIST) {
        Curl_infof(pSVar5,"Getting file with size: %ld\n",lVar24);
      }
      (conn->proto).ftpc.state_saved = instate;
      (conn->proto).ftpc.retr_size_saved = lVar24;
      if ((pSVar5->set).ftp_use_port == true) {
        CVar12 = AllowServerConnect(conn,(_Bool *)&secs);
        if (CVar12 == CURLE_OK) {
          if ((char)secs == '\0') {
            Curl_infof(pSVar5,"Data conn was not available immediately\n");
            (conn->proto).ftpc.state = FTP_STOP;
            (conn->proto).ftpc.wait_data_conn = true;
          }
          return CURLE_OK;
        }
        return CVar12;
      }
      goto LAB_00520288;
    }
    if (ftpcode != 0x1c2 || instate != FTP_LIST) {
      Curl_failf(pSVar5,"RETR response: %03d",(ulong)(uint)ftpcode);
      if (ftpcode == 0x226 && instate == FTP_RETR) {
        return CURLE_REMOTE_FILE_NOT_FOUND;
      }
      return CURLE_FTP_COULDNT_RETR_FILE;
    }
    *(undefined4 *)((long)pvVar6 + 0x18) = 2;
    goto switchD_0051f7dc_default;
  case FTP_STOR:
    pSVar5 = conn->data;
    if (399 < ftpcode) {
      Curl_failf(pSVar5,"Failed FTP upload: %0d",(ulong)(uint)ftpcode);
      (conn->proto).ftpc.state = FTP_STOP;
      return CURLE_UPLOAD_FAILED;
    }
    (conn->proto).ftpc.state_saved = FTP_STOR;
    if ((pSVar5->set).ftp_use_port == true) {
      (conn->proto).ftpc.state = FTP_STOP;
      CVar12 = AllowServerConnect(conn,(_Bool *)&secs);
      if (CVar12 != CURLE_OK) {
        return CVar12;
      }
      if ((char)secs == '\0') {
        Curl_infof(pSVar5,"Data conn was not available immediately\n");
        (conn->proto).ftpc.wait_data_conn = true;
        return CURLE_OK;
      }
      return CURLE_OK;
    }
LAB_00520288:
    CVar12 = InitiateTransfer(conn);
  }
  return CVar12;
}

Assistant:

static CURLcode ftp_statemach_act(struct connectdata *conn)
{
  CURLcode result;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  struct SessionHandle *data=conn->data;
  int ftpcode;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  static const char ftpauth[][4]  = { "SSL", "TLS" };
  size_t nread = 0;

  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  result = ftp_readresp(sock, pp, &ftpcode, &nread);
  if(result)
    return result;

  if(ftpcode) {
    /* we have now received a full FTP server response */
    switch(ftpc->state) {
    case FTP_WAIT220:
      if(ftpcode == 230)
        /* 230 User logged in - already! */
        return ftp_state_user_resp(conn, ftpcode, ftpc->state);
      else if(ftpcode != 220) {
        failf(data, "Got a %03d ftp-server response when 220 was expected",
              ftpcode);
        return CURLE_FTP_WEIRD_SERVER_REPLY;
      }

      /* We have received a 220 response fine, now we proceed. */
#ifdef HAVE_GSSAPI
      if(data->set.krb) {
        /* If not anonymous login, try a secure login. Note that this
           procedure is still BLOCKING. */

        Curl_sec_request_prot(conn, "private");
        /* We set private first as default, in case the line below fails to
           set a valid level */
        Curl_sec_request_prot(conn, data->set.str[STRING_KRB_LEVEL]);

        if(Curl_sec_login(conn))
          infof(data, "Logging in with password in cleartext!\n");
        else
          infof(data, "Authentication successful\n");
      }
#endif

      if(data->set.use_ssl && !conn->ssl[FIRSTSOCKET].use) {
        /* We don't have a SSL/TLS connection yet, but FTPS is
           requested. Try a FTPS connection now */

        ftpc->count3=0;
        switch(data->set.ftpsslauth) {
        case CURLFTPAUTH_DEFAULT:
        case CURLFTPAUTH_SSL:
          ftpc->count2 = 1; /* add one to get next */
          ftpc->count1 = 0;
          break;
        case CURLFTPAUTH_TLS:
          ftpc->count2 = -1; /* subtract one to get next */
          ftpc->count1 = 1;
          break;
        default:
          failf(data, "unsupported parameter to CURLOPT_FTPSSLAUTH: %d",
                (int)data->set.ftpsslauth);
          return CURLE_UNKNOWN_OPTION; /* we don't know what to do */
        }
        PPSENDF(&ftpc->pp, "AUTH %s", ftpauth[ftpc->count1]);
        state(conn, FTP_AUTH);
      }
      else {
        result = ftp_state_user(conn);
        if(result)
          return result;
      }

      break;

    case FTP_AUTH:
      /* we have gotten the response to a previous AUTH command */

      /* RFC2228 (page 5) says:
       *
       * If the server is willing to accept the named security mechanism,
       * and does not require any security data, it must respond with
       * reply code 234/334.
       */

      if((ftpcode == 234) || (ftpcode == 334)) {
        /* Curl_ssl_connect is BLOCKING */
        result = Curl_ssl_connect(conn, FIRSTSOCKET);
        if(!result) {
          conn->ssl[SECONDARYSOCKET].use = FALSE; /* clear-text data */
          result = ftp_state_user(conn);
        }
      }
      else if(ftpc->count3 < 1) {
        ftpc->count3++;
        ftpc->count1 += ftpc->count2; /* get next attempt */
        result = Curl_pp_sendf(&ftpc->pp, "AUTH %s", ftpauth[ftpc->count1]);
        /* remain in this same state */
      }
      else {
        if(data->set.use_ssl > CURLUSESSL_TRY)
          /* we failed and CURLUSESSL_CONTROL or CURLUSESSL_ALL is set */
          result = CURLE_USE_SSL_FAILED;
        else
          /* ignore the failure and continue */
          result = ftp_state_user(conn);
      }

      if(result)
        return result;
      break;

    case FTP_USER:
    case FTP_PASS:
      result = ftp_state_user_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_ACCT:
      result = ftp_state_acct_resp(conn, ftpcode);
      break;

    case FTP_PBSZ:
      PPSENDF(&ftpc->pp, "PROT %c",
              data->set.use_ssl == CURLUSESSL_CONTROL ? 'C' : 'P');
      state(conn, FTP_PROT);

      break;

    case FTP_PROT:
      if(ftpcode/100 == 2)
        /* We have enabled SSL for the data connection! */
        conn->ssl[SECONDARYSOCKET].use =
          (data->set.use_ssl != CURLUSESSL_CONTROL) ? TRUE : FALSE;
      /* FTP servers typically responds with 500 if they decide to reject
         our 'P' request */
      else if(data->set.use_ssl > CURLUSESSL_CONTROL)
        /* we failed and bails out */
        return CURLE_USE_SSL_FAILED;

      if(data->set.ftp_ccc) {
        /* CCC - Clear Command Channel
         */
        PPSENDF(&ftpc->pp, "%s", "CCC");
        state(conn, FTP_CCC);
      }
      else {
        result = ftp_state_pwd(conn);
        if(result)
          return result;
      }
      break;

    case FTP_CCC:
      if(ftpcode < 500) {
        /* First shut down the SSL layer (note: this call will block) */
        result = Curl_ssl_shutdown(conn, FIRSTSOCKET);

        if(result) {
          failf(conn->data, "Failed to clear the command channel (CCC)");
          return result;
        }
      }

      /* Then continue as normal */
      result = ftp_state_pwd(conn);
      if(result)
        return result;
      break;

    case FTP_PWD:
      if(ftpcode == 257) {
        char *ptr=&data->state.buffer[4];  /* start on the first letter */
        char *dir;
        char *store;

        dir = malloc(nread + 1);
        if(!dir)
          return CURLE_OUT_OF_MEMORY;

        /* Reply format is like
           257<space>[rubbish]"<directory-name>"<space><commentary> and the
           RFC959 says

           The directory name can contain any character; embedded
           double-quotes should be escaped by double-quotes (the
           "quote-doubling" convention).
        */

        /* scan for the first double-quote for non-standard responses */
        while(ptr < &data->state.buffer[sizeof(data->state.buffer)]
              && *ptr != '\n' && *ptr != '\0' && *ptr != '"')
          ptr++;

        if('\"' == *ptr) {
          /* it started good */
          ptr++;
          for(store = dir; *ptr;) {
            if('\"' == *ptr) {
              if('\"' == ptr[1]) {
                /* "quote-doubling" */
                *store = ptr[1];
                ptr++;
              }
              else {
                /* end of path */
                *store = '\0'; /* zero terminate */
                break; /* get out of this loop */
              }
            }
            else
              *store = *ptr;
            store++;
            ptr++;
          }

          /* If the path name does not look like an absolute path (i.e.: it
             does not start with a '/'), we probably need some server-dependent
             adjustments. For example, this is the case when connecting to
             an OS400 FTP server: this server supports two name syntaxes,
             the default one being incompatible with standard pathes. In
             addition, this server switches automatically to the regular path
             syntax when one is encountered in a command: this results in
             having an entrypath in the wrong syntax when later used in CWD.
               The method used here is to check the server OS: we do it only
             if the path name looks strange to minimize overhead on other
             systems. */

          if(!ftpc->server_os && dir[0] != '/') {

            result = Curl_pp_sendf(&ftpc->pp, "%s", "SYST");
            if(result) {
              free(dir);
              return result;
            }
            Curl_safefree(ftpc->entrypath);
            ftpc->entrypath = dir; /* remember this */
            infof(data, "Entry path is '%s'\n", ftpc->entrypath);
            /* also save it where getinfo can access it: */
            data->state.most_recent_ftp_entrypath = ftpc->entrypath;
            state(conn, FTP_SYST);
            break;
          }

          Curl_safefree(ftpc->entrypath);
          ftpc->entrypath = dir; /* remember this */
          infof(data, "Entry path is '%s'\n", ftpc->entrypath);
          /* also save it where getinfo can access it: */
          data->state.most_recent_ftp_entrypath = ftpc->entrypath;
        }
        else {
          /* couldn't get the path */
          free(dir);
          infof(data, "Failed to figure out path\n");
        }
      }
      state(conn, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE\n"));
      break;

    case FTP_SYST:
      if(ftpcode == 215) {
        char *ptr=&data->state.buffer[4];  /* start on the first letter */
        char *os;
        char *store;

        os = malloc(nread + 1);
        if(!os)
          return CURLE_OUT_OF_MEMORY;

        /* Reply format is like
           215<space><OS-name><space><commentary>
        */
        while(*ptr == ' ')
          ptr++;
        for(store = os; *ptr && *ptr != ' ';)
          *store++ = *ptr++;
        *store = '\0'; /* zero terminate */

        /* Check for special servers here. */

        if(strequal(os, "OS/400")) {
          /* Force OS400 name format 1. */
          result = Curl_pp_sendf(&ftpc->pp, "%s", "SITE NAMEFMT 1");
          if(result) {
            free(os);
            return result;
          }
          /* remember target server OS */
          Curl_safefree(ftpc->server_os);
          ftpc->server_os = os;
          state(conn, FTP_NAMEFMT);
          break;
        }
        else {
          /* Nothing special for the target server. */
          /* remember target server OS */
          Curl_safefree(ftpc->server_os);
          ftpc->server_os = os;
        }
      }
      else {
        /* Cannot identify server OS. Continue anyway and cross fingers. */
      }

      state(conn, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE\n"));
      break;

    case FTP_NAMEFMT:
      if(ftpcode == 250) {
        /* Name format change successful: reload initial path. */
        ftp_state_pwd(conn);
        break;
      }

      state(conn, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE\n"));
      break;

    case FTP_QUOTE:
    case FTP_POSTQUOTE:
    case FTP_RETR_PREQUOTE:
    case FTP_STOR_PREQUOTE:
      if((ftpcode >= 400) && !ftpc->count2) {
        /* failure response code, and not allowed to fail */
        failf(conn->data, "QUOT command failed with %03d", ftpcode);
        return CURLE_QUOTE_ERROR;
      }
      result = ftp_state_quote(conn, FALSE, ftpc->state);
      if(result)
        return result;

      break;

    case FTP_CWD:
      if(ftpcode/100 != 2) {
        /* failure to CWD there */
        if(conn->data->set.ftp_create_missing_dirs &&
           ftpc->count1 && !ftpc->count2) {
          /* try making it */
          ftpc->count2++; /* counter to prevent CWD-MKD loops */
          PPSENDF(&ftpc->pp, "MKD %s", ftpc->dirs[ftpc->count1 - 1]);
          state(conn, FTP_MKD);
        }
        else {
          /* return failure */
          failf(data, "Server denied you to change to the given directory");
          ftpc->cwdfail = TRUE; /* don't remember this path as we failed
                                   to enter it */
          return CURLE_REMOTE_ACCESS_DENIED;
        }
      }
      else {
        /* success */
        ftpc->count2=0;
        if(++ftpc->count1 <= ftpc->dirdepth) {
          /* send next CWD */
          PPSENDF(&ftpc->pp, "CWD %s", ftpc->dirs[ftpc->count1 - 1]);
        }
        else {
          result = ftp_state_mdtm(conn);
          if(result)
            return result;
        }
      }
      break;

    case FTP_MKD:
      if((ftpcode/100 != 2) && !ftpc->count3--) {
        /* failure to MKD the dir */
        failf(data, "Failed to MKD dir: %03d", ftpcode);
        return CURLE_REMOTE_ACCESS_DENIED;
      }
      state(conn, FTP_CWD);
      /* send CWD */
      PPSENDF(&ftpc->pp, "CWD %s", ftpc->dirs[ftpc->count1 - 1]);
      break;

    case FTP_MDTM:
      result = ftp_state_mdtm_resp(conn, ftpcode);
      break;

    case FTP_TYPE:
    case FTP_LIST_TYPE:
    case FTP_RETR_TYPE:
    case FTP_STOR_TYPE:
      result = ftp_state_type_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_SIZE:
    case FTP_RETR_SIZE:
    case FTP_STOR_SIZE:
      result = ftp_state_size_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_REST:
    case FTP_RETR_REST:
      result = ftp_state_rest_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_PRET:
      if(ftpcode != 200) {
        /* there only is this one standard OK return code. */
        failf(data, "PRET command not accepted: %03d", ftpcode);
        return CURLE_FTP_PRET_FAILED;
      }
      result = ftp_state_use_pasv(conn);
      break;

    case FTP_PASV:
      result = ftp_state_pasv_resp(conn, ftpcode);
      break;

    case FTP_PORT:
      result = ftp_state_port_resp(conn, ftpcode);
      break;

    case FTP_LIST:
    case FTP_RETR:
      result = ftp_state_get_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_STOR:
      result = ftp_state_stor_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, FTP_STOP);
      break;
    }
  } /* if(ftpcode) */

  return result;
}